

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void V_UpdateModeSize(int width,int height)

{
  undefined8 in_RAX;
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int cx2;
  int cx1;
  
  _cx2 = in_RAX;
  V_CalcCleanFacs(0x140,200,width,height,&CleanXfac,&CleanYfac,&cx1,&cx2);
  uVar3 = (ulong)(uint)CleanXfac;
  CleanWidth = width / CleanXfac;
  CleanHeight = height / CleanYfac;
  if (CleanWidth < 0x140) {
    __assert_fail("CleanWidth >= 320",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x52b,"void V_UpdateModeSize(int, int)");
  }
  if (CleanHeight < 200) {
    __assert_fail("CleanHeight >= 200",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x52c,"void V_UpdateModeSize(int, int)");
  }
  if (width - 0x3c0U < 0xffffff60) {
    if (cx1 < cx2) {
      CleanXfac_1 = cx1;
    }
    else {
      cx1 = 2;
      uVar3 = (ulong)(uint)CleanXfac;
      if (CleanXfac < 3) {
        uVar3 = 2;
      }
      CleanXfac_1 = (int)uVar3;
      if (2 < CleanYfac) {
        cx1 = CleanYfac;
      }
      iVar1 = CleanXfac_1 * 0x140;
      do {
        CleanXfac_1 = CleanXfac_1 - 1;
        iVar1 = iVar1 + -0x140;
        cx1 = cx1 + -1;
        if ((uint)CleanXfac_1 < 3) break;
      } while (((screen->super_DSimpleCanvas).super_DCanvas.Width * 3) / 4 < iVar1);
    }
    CleanWidth_1 = width / CleanXfac_1;
    piVar2 = (int *)((long)height % (long)cx1 & 0xffffffff);
    CleanHeight_1 = height / cx1;
    CleanYfac_1 = cx1;
  }
  else {
    CleanXfac_1 = CleanXfac;
    CleanYfac_1 = CleanYfac;
    piVar2 = &CleanWidth_1;
    CleanHeight_1 = CleanHeight;
    CleanWidth_1 = CleanWidth;
  }
  R_OldBlend = 0xffffffff;
  DisplayWidth = width;
  DisplayHeight = height;
  (*Renderer->_vptr_FRenderer[0xc])(Renderer,uVar3,piVar2);
  return;
}

Assistant:

void V_UpdateModeSize (int width, int height)
{
	int cx1, cx2;
	V_CalcCleanFacs(320, 200, width, height, &CleanXfac, &CleanYfac, &cx1, &cx2);

	CleanWidth = width / CleanXfac;
	CleanHeight = height / CleanYfac;
	assert(CleanWidth >= 320);
	assert(CleanHeight >= 200);

	if (width < 800 || width >= 960)
	{
		if (cx1 < cx2)
		{
			// Special case in which we don't need to scale down.
			CleanXfac_1 = 
			CleanYfac_1 = cx1;
		}
		else
		{
			CleanXfac_1 = MAX(CleanXfac - 1, 1);
			CleanYfac_1 = MAX(CleanYfac - 1, 1);
			// On larger screens this is not enough so make sure it's at most 3/4 of the screen's width
			while (CleanXfac_1 * 320 > screen->GetWidth()*3/4 && CleanXfac_1 > 2)
			{
				CleanXfac_1--;
				CleanYfac_1--;
			}
		}
		CleanWidth_1 = width / CleanXfac_1;
		CleanHeight_1 = height / CleanYfac_1;
	}
	else // if the width is between 800 and 960 the ratio between the screensize and CleanXFac-1 becomes too large.
	{
		CleanXfac_1 = CleanXfac;
		CleanYfac_1 = CleanYfac;
		CleanWidth_1 = CleanWidth;
		CleanHeight_1 = CleanHeight;
	}


	DisplayWidth = width;
	DisplayHeight = height;

	R_OldBlend = ~0;
	Renderer->OnModeSet();
}